

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall absl::time_internal::cctz::TimeZoneInfo::ExtendTransitions(TimeZoneInfo *this)

{
  pointer *ppTVar1;
  byte bVar2;
  pointer pTVar3;
  pointer pTVar4;
  iterator iVar5;
  long lVar6;
  int_least64_t iVar7;
  int_least64_t iVar8;
  int_least8_t iVar9;
  int_least8_t iVar10;
  int_least8_t iVar11;
  int_least8_t iVar12;
  int_least8_t iVar13;
  undefined3 uVar14;
  int_least8_t iVar15;
  int_least8_t iVar16;
  int_least8_t iVar17;
  int_least8_t iVar18;
  int_least8_t iVar19;
  undefined3 uVar20;
  uint_least8_t uVar21;
  undefined7 uVar22;
  bool bVar23;
  bool bVar24;
  weekday wVar25;
  ulong uVar26;
  long lVar27;
  diff_t dVar28;
  int_fast64_t iVar29;
  int_fast64_t iVar30;
  ulong uVar31;
  long lVar32;
  Transition *__args;
  Transition *__args_00;
  int jan1_weekday;
  uint_least8_t dst_ti;
  uint_least8_t std_ti;
  Transition dst;
  PosixTimeZone posix;
  Transition std;
  civil_second jan1;
  uint_fast8_t local_13a;
  byte local_139;
  vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
  *local_138;
  int_fast64_t local_130;
  long local_128;
  Transition local_120;
  PosixTimeZone local_f0;
  Transition local_70;
  civil_second local_40;
  
  this->extended_ = false;
  if ((this->future_spec_)._M_string_length == 0) {
    return true;
  }
  local_f0.std_abbr._M_dataplus._M_p = (pointer)&local_f0.std_abbr.field_2;
  bVar24 = false;
  local_f0.std_abbr._M_string_length = 0;
  local_f0.std_abbr.field_2._M_local_buf[0] = '\0';
  local_f0.dst_abbr._M_dataplus._M_p = (pointer)&local_f0.dst_abbr.field_2;
  local_f0.dst_abbr._M_string_length = 0;
  local_f0.dst_abbr.field_2._M_local_buf[0] = '\0';
  bVar23 = ParsePosixSpec(&this->future_spec_,&local_f0);
  if (bVar23) {
    bVar24 = false;
    bVar23 = GetTransitionType(this,local_f0.std_offset,false,&local_f0.std_abbr,&local_139);
    if (bVar23) {
      if (local_f0.dst_abbr._M_string_length == 0) {
        bVar2 = (this->transitions_).
                super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].type_index;
        bVar24 = true;
        if (bVar2 == local_139) goto LAB_0014a842;
        pTVar3 = (this->transition_types_).
                 super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar26 = (ulong)((uint)bVar2 * 0x30);
        uVar31 = (ulong)((uint)local_139 * 0x30);
        if (*(int *)((long)&pTVar3->utc_offset + uVar26) ==
            *(int *)((long)&pTVar3->utc_offset + uVar31)) {
          if ((&pTVar3->is_dst)[uVar26] == (&pTVar3->is_dst)[uVar31]) {
            bVar24 = (&pTVar3->abbr_index)[uVar26] == (&pTVar3->abbr_index)[uVar31];
            goto LAB_0014a842;
          }
        }
      }
      else {
        bVar23 = GetTransitionType(this,local_f0.dst_offset,true,&local_f0.dst_abbr,&local_13a);
        if (bVar23) {
          if (((((local_f0.dst_start.date.fmt == N) &&
                (local_f0.dst_start.date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x0)) &&
               (local_f0.dst_start.time.offset == 0)) &&
              ((local_f0.dst_end.date.fmt == J &&
               (local_f0.dst_end.date.field_1 == (anon_union_8_3_4e90bb4b_for_Date_1)0x16d)))) &&
             ((local_f0.std_offset - local_f0.dst_offset) + local_f0.dst_end.time.offset == 0x15180)
             ) {
            bVar24 = EquivTransitions(this,(this->transitions_).
                                           super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                                           ._M_impl.super__Vector_impl_data._M_finish[-1].type_index
                                      ,local_13a);
          }
          else {
            local_138 = (vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
                         *)&this->transitions_;
            ::std::
            vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
            ::reserve((vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                       *)local_138,
                      ((long)(this->transitions_).
                             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->transitions_).
                             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 +
                      0x324);
            this->extended_ = true;
            pTVar4 = (this->transitions_).
                     super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_130 = pTVar4[-1].unix_time;
            LocalTime((absolute_lookup *)&local_120,this,local_130,
                      (TransitionType *)
                      ((long)&((this->transition_types_).
                               super__Vector_base<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
                               ._M_impl.super__Vector_impl_data._M_start)->utc_offset +
                      (ulong)((uint)pTVar4[-1].type_index * 0x30)));
            this->last_year_ = local_120.unix_time;
            bVar23 = false;
            if ((local_120.unix_time & 3U) == 0) {
              lVar27 = local_120.unix_time * -0x70a3d70a3d70a3d7;
              bVar23 = true;
              if ((lVar27 + 0x51eb851eb851eb8U >> 2 | lVar27 << 0x3e) < 0x28f5c28f5c28f5d) {
                bVar23 = (lVar27 + 0x51eb851eb851eb0U >> 4 | lVar27 << 0x3c) < 0xa3d70a3d70a3d7;
              }
            }
            local_40.f_.y = local_120.unix_time;
            local_40.f_.m = '\x01';
            local_40.f_.d = '\x01';
            local_40.f_.hh = '\0';
            local_40.f_.mm = '\0';
            local_40.f_._12_4_ = local_40.f_._12_4_ & 0xffffff00;
            dVar28 = detail::difference((detail *)local_120.unix_time,
                                        CONCAT44(local_40.f_._12_4_,0x101),0x7b2,0x101);
            lVar27 = dVar28 * 0x3c;
            wVar25 = detail::get_weekday(&local_40);
            jan1_weekday = wVar25 + tuesday;
            if (saturday < wVar25) {
              jan1_weekday = 0;
            }
            local_120.unix_time = 0;
            local_120.type_index = local_13a;
            local_120.civil_sec.f_.y = 0x7b2;
            local_120.civil_sec.f_.m = '\x01';
            local_120.civil_sec.f_.d = '\x01';
            local_120.civil_sec.f_.hh = '\0';
            local_120.civil_sec.f_.mm = '\0';
            local_120.civil_sec.f_.ss = '\0';
            local_120.prev_civil_sec.f_.y = 0x7b2;
            local_120.prev_civil_sec.f_.m = '\x01';
            local_120.prev_civil_sec.f_.d = '\x01';
            local_120.prev_civil_sec.f_.hh = '\0';
            local_120.prev_civil_sec.f_.mm = '\0';
            local_120.prev_civil_sec.f_.ss = '\0';
            local_70.unix_time = 0;
            local_70.type_index = local_139;
            local_70.civil_sec.f_.y = 0x7b2;
            local_70.civil_sec.f_.m = '\x01';
            local_70.civil_sec.f_.d = '\x01';
            local_70.civil_sec.f_.hh = '\0';
            local_70.civil_sec.f_.mm = '\0';
            local_70.civil_sec.f_.ss = '\0';
            local_70.prev_civil_sec.f_.y = 0x7b2;
            local_70.prev_civil_sec.f_.m = '\x01';
            local_70.prev_civil_sec.f_.d = '\x01';
            local_70.prev_civil_sec.f_.hh = '\0';
            local_70.prev_civil_sec.f_.mm = '\0';
            local_70.prev_civil_sec.f_.ss = '\0';
            local_128 = this->last_year_ + 0x191;
            while( true ) {
              iVar29 = anon_unknown_0::TransOffset(bVar23,jan1_weekday,&local_f0.dst_start);
              iVar30 = anon_unknown_0::TransOffset(bVar23,jan1_weekday,&local_f0.dst_end);
              local_120.unix_time = (iVar29 + lVar27) - local_f0.std_offset;
              local_70.unix_time = (iVar30 + lVar27) - local_f0.dst_offset;
              __args = &local_120;
              __args_00 = &local_70;
              if (local_70.unix_time <= local_120.unix_time) {
                __args = &local_70;
                __args_00 = &local_120;
              }
              if (local_130 < __args_00->unix_time) {
                if (local_130 < __args->unix_time) {
                  iVar5._M_current =
                       (this->transitions_).
                       super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar5._M_current ==
                      (this->transitions_).
                      super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::
                    vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
                    ::_M_realloc_insert<absl::time_internal::cctz::Transition_const&>
                              (local_138,iVar5,__args);
                  }
                  else {
                    iVar7 = __args->unix_time;
                    uVar21 = __args->type_index;
                    uVar22 = *(undefined7 *)&__args->field_0x9;
                    iVar8 = (__args->civil_sec).f_.y;
                    iVar15 = (__args->civil_sec).f_.m;
                    iVar16 = (__args->civil_sec).f_.d;
                    iVar17 = (__args->civil_sec).f_.hh;
                    iVar18 = (__args->civil_sec).f_.mm;
                    iVar19 = (__args->civil_sec).f_.ss;
                    uVar20 = *(undefined3 *)&(__args->civil_sec).f_.field_0xd;
                    iVar9 = (__args->prev_civil_sec).f_.m;
                    iVar10 = (__args->prev_civil_sec).f_.d;
                    iVar11 = (__args->prev_civil_sec).f_.hh;
                    iVar12 = (__args->prev_civil_sec).f_.mm;
                    iVar13 = (__args->prev_civil_sec).f_.ss;
                    uVar14 = *(undefined3 *)&(__args->prev_civil_sec).f_.field_0xd;
                    ((iVar5._M_current)->prev_civil_sec).f_.y = (__args->prev_civil_sec).f_.y;
                    ((iVar5._M_current)->prev_civil_sec).f_.m = iVar9;
                    ((iVar5._M_current)->prev_civil_sec).f_.d = iVar10;
                    ((iVar5._M_current)->prev_civil_sec).f_.hh = iVar11;
                    ((iVar5._M_current)->prev_civil_sec).f_.mm = iVar12;
                    ((iVar5._M_current)->prev_civil_sec).f_.ss = iVar13;
                    *(undefined3 *)&((iVar5._M_current)->prev_civil_sec).f_.field_0xd = uVar14;
                    ((iVar5._M_current)->civil_sec).f_.y = iVar8;
                    ((iVar5._M_current)->civil_sec).f_.m = iVar15;
                    ((iVar5._M_current)->civil_sec).f_.d = iVar16;
                    ((iVar5._M_current)->civil_sec).f_.hh = iVar17;
                    ((iVar5._M_current)->civil_sec).f_.mm = iVar18;
                    ((iVar5._M_current)->civil_sec).f_.ss = iVar19;
                    *(undefined3 *)&((iVar5._M_current)->civil_sec).f_.field_0xd = uVar20;
                    (iVar5._M_current)->unix_time = iVar7;
                    (iVar5._M_current)->type_index = uVar21;
                    *(undefined7 *)&(iVar5._M_current)->field_0x9 = uVar22;
                    ppTVar1 = &(this->transitions_).
                               super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppTVar1 = *ppTVar1 + 1;
                  }
                }
                iVar5._M_current =
                     (this->transitions_).
                     super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->transitions_).
                    super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::
                  vector<absl::time_internal::cctz::Transition,std::allocator<absl::time_internal::cctz::Transition>>
                  ::_M_realloc_insert<absl::time_internal::cctz::Transition_const&>
                            (local_138,iVar5,__args_00);
                }
                else {
                  iVar7 = __args_00->unix_time;
                  uVar21 = __args_00->type_index;
                  uVar22 = *(undefined7 *)&__args_00->field_0x9;
                  iVar8 = (__args_00->civil_sec).f_.y;
                  iVar15 = (__args_00->civil_sec).f_.m;
                  iVar16 = (__args_00->civil_sec).f_.d;
                  iVar17 = (__args_00->civil_sec).f_.hh;
                  iVar18 = (__args_00->civil_sec).f_.mm;
                  iVar19 = (__args_00->civil_sec).f_.ss;
                  uVar20 = *(undefined3 *)&(__args_00->civil_sec).f_.field_0xd;
                  iVar9 = (__args_00->prev_civil_sec).f_.m;
                  iVar10 = (__args_00->prev_civil_sec).f_.d;
                  iVar11 = (__args_00->prev_civil_sec).f_.hh;
                  iVar12 = (__args_00->prev_civil_sec).f_.mm;
                  iVar13 = (__args_00->prev_civil_sec).f_.ss;
                  uVar14 = *(undefined3 *)&(__args_00->prev_civil_sec).f_.field_0xd;
                  ((iVar5._M_current)->prev_civil_sec).f_.y = (__args_00->prev_civil_sec).f_.y;
                  ((iVar5._M_current)->prev_civil_sec).f_.m = iVar9;
                  ((iVar5._M_current)->prev_civil_sec).f_.d = iVar10;
                  ((iVar5._M_current)->prev_civil_sec).f_.hh = iVar11;
                  ((iVar5._M_current)->prev_civil_sec).f_.mm = iVar12;
                  ((iVar5._M_current)->prev_civil_sec).f_.ss = iVar13;
                  *(undefined3 *)&((iVar5._M_current)->prev_civil_sec).f_.field_0xd = uVar14;
                  ((iVar5._M_current)->civil_sec).f_.y = iVar8;
                  ((iVar5._M_current)->civil_sec).f_.m = iVar15;
                  ((iVar5._M_current)->civil_sec).f_.d = iVar16;
                  ((iVar5._M_current)->civil_sec).f_.hh = iVar17;
                  ((iVar5._M_current)->civil_sec).f_.mm = iVar18;
                  ((iVar5._M_current)->civil_sec).f_.ss = iVar19;
                  *(undefined3 *)&((iVar5._M_current)->civil_sec).f_.field_0xd = uVar20;
                  (iVar5._M_current)->unix_time = iVar7;
                  (iVar5._M_current)->type_index = uVar21;
                  *(undefined7 *)&(iVar5._M_current)->field_0x9 = uVar22;
                  ppTVar1 = &(this->transitions_).
                             super__Vector_base<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppTVar1 = *ppTVar1 + 1;
                }
              }
              lVar6 = this->last_year_;
              if (lVar6 != local_128) {
                lVar27 = lVar27 + *(int *)((long)&(anonymous_namespace)::kSecsPerYear +
                                          (ulong)((uint)bVar23 * 4));
                jan1_weekday = (jan1_weekday +
                               *(int *)((long)&(anonymous_namespace)::kDaysPerYear +
                                       (ulong)((uint)bVar23 * 4))) % 7;
                if ((bVar23 == false) && ((lVar6 + 1U & 3) == 0)) {
                  lVar32 = (lVar6 + 1U) * -0x70a3d70a3d70a3d7;
                  bVar23 = true;
                  if ((lVar32 + 0x51eb851eb851eb8U >> 2 | lVar32 << 0x3e) < 0x28f5c28f5c28f5d) {
                    bVar23 = (lVar32 + 0x51eb851eb851eb0U >> 4 | lVar32 << 0x3c) < 0xa3d70a3d70a3d7;
                  }
                }
                else {
                  bVar23 = false;
                }
              }
              if (lVar6 == local_128) break;
              this->last_year_ = lVar6 + 1;
            }
            bVar24 = true;
          }
          goto LAB_0014a842;
        }
      }
      bVar24 = false;
    }
  }
LAB_0014a842:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.dst_abbr._M_dataplus._M_p != &local_f0.dst_abbr.field_2) {
    operator_delete(local_f0.dst_abbr._M_dataplus._M_p,
                    CONCAT71(local_f0.dst_abbr.field_2._M_allocated_capacity._1_7_,
                             local_f0.dst_abbr.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.std_abbr._M_dataplus._M_p != &local_f0.std_abbr.field_2) {
    operator_delete(local_f0.std_abbr._M_dataplus._M_p,
                    CONCAT71(local_f0.std_abbr.field_2._M_allocated_capacity._1_7_,
                             local_f0.std_abbr.field_2._M_local_buf[0]) + 1);
  }
  return bVar24;
}

Assistant:

bool TimeZoneInfo::ExtendTransitions() {
  extended_ = false;
  if (future_spec_.empty()) return true;  // last transition prevails

  PosixTimeZone posix;
  if (!ParsePosixSpec(future_spec_, &posix)) return false;

  // Find transition type for the future std specification.
  std::uint_least8_t std_ti;
  if (!GetTransitionType(posix.std_offset, false, posix.std_abbr, &std_ti))
    return false;

  if (posix.dst_abbr.empty()) {  // std only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, std_ti);
  }

  // Find transition type for the future dst specification.
  std::uint_least8_t dst_ti;
  if (!GetTransitionType(posix.dst_offset, true, posix.dst_abbr, &dst_ti))
    return false;

  if (AllYearDST(posix)) {  // dst only
    // The future specification should match the last transition, and
    // that means that handling the future will fall out naturally.
    return EquivTransitions(transitions_.back().type_index, dst_ti);
  }

  // Extend the transitions for an additional 401 years using the future
  // specification. Years beyond those can be handled by mapping back to
  // a cycle-equivalent year within that range. Note that we need 401
  // (well, at least the first transition in the 401st year) so that the
  // end of the 400th year is mapped back to an extended year. And first
  // we may also need two additional transitions for the current year.
  transitions_.reserve(transitions_.size() + 2 + 401 * 2);
  extended_ = true;

  const Transition& last(transitions_.back());
  const std::int_fast64_t last_time = last.unix_time;
  const TransitionType& last_tt(transition_types_[last.type_index]);
  last_year_ = LocalTime(last_time, last_tt).cs.year();
  bool leap_year = IsLeap(last_year_);
  const civil_second jan1(last_year_);
  std::int_fast64_t jan1_time = jan1 - civil_second();
  int jan1_weekday = ToPosixWeekday(get_weekday(jan1));

  Transition dst = {0, dst_ti, civil_second(), civil_second()};
  Transition std = {0, std_ti, civil_second(), civil_second()};
  for (const year_t limit = last_year_ + 401;; ++last_year_) {
    auto dst_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_start);
    auto std_trans_off = TransOffset(leap_year, jan1_weekday, posix.dst_end);
    dst.unix_time = jan1_time + dst_trans_off - posix.std_offset;
    std.unix_time = jan1_time + std_trans_off - posix.dst_offset;
    const auto* ta = dst.unix_time < std.unix_time ? &dst : &std;
    const auto* tb = dst.unix_time < std.unix_time ? &std : &dst;
    if (last_time < tb->unix_time) {
      if (last_time < ta->unix_time) transitions_.push_back(*ta);
      transitions_.push_back(*tb);
    }
    if (last_year_ == limit) break;
    jan1_time += kSecsPerYear[leap_year];
    jan1_weekday = (jan1_weekday + kDaysPerYear[leap_year]) % 7;
    leap_year = !leap_year && IsLeap(last_year_ + 1);
  }

  return true;
}